

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_address.cpp
# Opt level: O1

string * __thiscall
miniros::network::NetAddress::str_abi_cxx11_(string *__return_storage_ptr__,NetAddress *this)

{
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,(this->address)._M_dataplus._M_p,(this->address)._M_string_length);
  if (this->port != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_190,":",1);
    std::ostream::operator<<((ostream *)local_190,this->port);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string NetAddress::str() const
{
  std::stringstream ss;
  ss << address;
  if (port) {
    ss << ":" << port;
  }
  return ss.str();
}